

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O1

QRect __thiscall
QItemDelegatePrivate::textLayoutBounds
          (QItemDelegatePrivate *this,QStyleOptionViewItem *option,QRect *decorationRect,
          QRect *checkRect)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidget *this_00;
  int iVar5;
  QStyle *pQVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  QRect QVar11;
  QSizeF QVar12;
  int local_40;
  
  uVar3 = (option->super_QStyleOption).rect.x1;
  uVar4 = (option->super_QStyleOption).rect.y1;
  QVar11.y1.m_i = uVar4;
  QVar11.x1.m_i = uVar3;
  uVar9._0_4_ = (option->super_QStyleOption).rect.x2;
  uVar9._4_4_ = (option->super_QStyleOption).rect.y2;
  this_00 = option->widget;
  if (this_00 == (QWidget *)0x0) {
    pQVar6 = QApplication::style();
  }
  else {
    pQVar6 = QWidget::style(this_00);
  }
  uVar1 = (option->features).super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
          super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i;
  iVar5 = (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,0x41,0,this_00);
  iVar5 = iVar5 + 1;
  if (option->decorationPosition - Top < 2) {
    iVar7 = 0x7ffffe;
    if ((uVar1 & 1) != 0) {
      iVar7 = ~(iVar5 * 2) + (option->decorationSize).wd.m_i;
    }
    uVar9 = uVar9 & 0xffffffff00000000 | (ulong)(uint)(iVar7 + uVar3);
  }
  else if (option->decorationPosition < Top) {
    iVar7 = 0x7ffffe;
    if (((uVar1 & 1) != 0) &&
       ((int)uVar4 <= (int)uVar9._4_4_ && (int)uVar3 <= (int)(undefined4)uVar9)) {
      iVar7 = (undefined4)uVar9 - (uVar3 + iVar5 * 2);
    }
    uVar9 = uVar9 & 0xffffffff00000000 | (ulong)(uint)(iVar7 + uVar3);
  }
  if ((uVar1 & 1) != 0) {
    iVar7 = (decorationRect->x1).m_i;
    iVar2 = (decorationRect->x2).m_i;
    if ((iVar2 != iVar7 + -1) || ((decorationRect->y2).m_i != (decorationRect->y1).m_i + -1)) {
      uVar9 = (ulong)(uint)(((int)uVar9 + iVar7 + ~(iVar5 * 2)) - iVar2);
    }
    iVar8 = (int)uVar9;
    iVar7 = (checkRect->x1).m_i;
    iVar2 = (checkRect->x2).m_i;
    if ((iVar2 != iVar7 + -1) || ((checkRect->y2).m_i != (checkRect->y1).m_i + -1)) {
      iVar8 = (iVar8 + iVar7 + ~(iVar5 * 2)) - iVar2;
    }
    QVar12 = doTextLayout(this,(iVar8 - uVar3) + 1);
    dVar10 = ceil(QVar12.ht);
    uVar9 = CONCAT44((int)dVar10 + uVar4 + -1,iVar8);
  }
  QVar11.x2.m_i = (int)uVar9;
  QVar11.y2.m_i = (int)(uVar9 >> 0x20);
  return QVar11;
}

Assistant:

QRect QItemDelegatePrivate::textLayoutBounds(const QStyleOptionViewItem &option,
                                             const QRect &decorationRect, const QRect &checkRect) const
{
    QRect rect = option.rect;
    const QWidget *w = widget(option);
    QStyle *style = w ? w->style() : QApplication::style();
    const bool wrapText = option.features & QStyleOptionViewItem::WrapText;
    // see QItemDelegate::drawDisplay
    const int textMargin = style->pixelMetric(QStyle::PM_FocusFrameHMargin, nullptr, w) + 1;
    switch (option.decorationPosition) {
    case QStyleOptionViewItem::Left:
    case QStyleOptionViewItem::Right:
        rect.setWidth(wrapText && rect.isValid() ? rect.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    case QStyleOptionViewItem::Top:
    case QStyleOptionViewItem::Bottom:
        rect.setWidth(wrapText ? option.decorationSize.width() - 2 * textMargin : (QFIXED_MAX));
        break;
    }

    if (wrapText) {
        if (!decorationRect.isNull())
            rect.setWidth(rect.width() - decorationRect.width() - 2 * textMargin);
        if (!checkRect.isNull())
            rect.setWidth(rect.width() - checkRect.width() - 2 * textMargin);
        // adjust height to be sure that the text fits
        const QSizeF size = doTextLayout(rect.width());
        rect.setHeight(qCeil(size.height()));
    }

    return rect;
}